

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

u32string * __thiscall
cs::codecvt::ascii::local2wide_abi_cxx11_
          (u32string *__return_storage_ptr__,ascii *this,deque<char,_std::allocator<char>_> *local)

{
  allocator<char32_t> local_49;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_48;
  _Deque_iterator<char,_const_char_&,_const_char_*> local_28;
  
  local_28._M_cur =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  local_28._M_first =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  local_28._M_last =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  local_28._M_node =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  local_48._M_cur =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  local_48._M_first =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  local_48._M_last =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  local_48._M_node =
       (local->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  std::__cxx11::u32string::u32string<std::_Deque_iterator<char,char_const&,char_const*>,void>
            ((u32string *)__return_storage_ptr__,&local_28,&local_48,&local_49);
  return __return_storage_ptr__;
}

Assistant:

std::u32string local2wide(const std::deque<char> &local) override
			{
				return std::u32string(local.begin(), local.end());
			}